

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O0

void duckdb::FSSTStorage::StringScanPartial<false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  FSSTScanState *pFVar1;
  idx_t iVar2;
  StringDictionaryContainer offsets_00;
  string_t *psVar3;
  StringDictionaryContainer dict_00;
  StringDictionaryContainer in_RDX;
  long in_RSI;
  ColumnSegment *in_RDI;
  long in_R8;
  idx_t i_1;
  VectorStringBuffer *str_buffer;
  uint32_t string_length;
  idx_t i;
  unsafe_unique_array<uint32_t> *delta_decode_buffer;
  unsafe_unique_array<uint32_t> *bitunpack_buffer;
  bp_delta_offsets_t offsets;
  idx_t string_block_limit;
  string_t *result_data;
  data_ptr_t base_data;
  StringDictionaryContainer dict;
  data_ptr_t baseptr;
  bool enable_fsst_vectors;
  idx_t start;
  FSSTScanState *scan_state;
  BufferHandle *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  idx_t in_stack_fffffffffffffef0;
  VectorStringBuffer *in_stack_fffffffffffffef8;
  FSSTScanState *scan_state_00;
  idx_t in_stack_ffffffffffffff08;
  anon_union_16_2_67f50693_for_value in_stack_ffffffffffffff10;
  FSSTScanState *in_stack_ffffffffffffff20;
  Vector *in_stack_ffffffffffffff60;
  
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
  operator->((unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
              *)in_stack_fffffffffffffee0);
  SegmentScanState::Cast<duckdb::FSSTScanState>((SegmentScanState *)in_stack_fffffffffffffee0);
  ColumnSegment::GetRelativeIndex(in_RDI,*(idx_t *)(in_RSI + 0x10));
  pFVar1 = (FSSTScanState *)BufferHandle::Ptr((BufferHandle *)0xa2e06a);
  iVar2 = ColumnSegment::GetBlockOffset(in_RDI);
  scan_state_00 = pFVar1;
  offsets_00 = GetDictionary((ColumnSegment *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                             in_stack_fffffffffffffee0);
  data_ptr_cast<unsigned_char>
            ((uchar *)((long)&(pFVar1->super_StringScanState).handle.handle.internal.
                              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + iVar2));
  if (in_RDX != (StringDictionaryContainer)0x0) {
    psVar3 = FlatVector::GetData<duckdb::string_t>((Vector *)0xa2e191);
    StartScan(in_stack_ffffffffffffff20,(data_ptr_t)in_stack_ffffffffffffff10.pointer.ptr,
              in_stack_ffffffffffffff10._0_8_,in_stack_ffffffffffffff08);
    StringVector::GetStringBuffer(in_stack_ffffffffffffff60);
    dict_00.size = 0;
    dict_00.end = 0;
    for (; (ulong)dict_00 < (ulong)in_RDX; dict_00 = (StringDictionaryContainer)((long)dict_00 + 1))
    {
      in_stack_ffffffffffffff10.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           FSSTScanState::DecompressString
                     ((FSSTScanState *)in_stack_ffffffffffffff10.pointer.ptr,dict_00,
                      in_stack_ffffffffffffff10._0_8_,(bp_delta_offsets_t *)offsets_00,
                      (idx_t)scan_state_00,in_stack_fffffffffffffef8);
      *(long *)&psVar3[(long)dict_00 + in_R8].value = in_stack_ffffffffffffff10._0_8_;
      psVar3[(long)dict_00 + in_R8].value.pointer.ptr = in_stack_ffffffffffffff10.pointer.ptr;
    }
    EndScan(scan_state_00,(bp_delta_offsets_t *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  return;
}

Assistant:

void FSSTStorage::StringScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                                    idx_t result_offset) {

	auto &scan_state = state.scan_state->Cast<FSSTScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	bool enable_fsst_vectors;
	if (ALLOW_FSST_VECTORS) {
		auto &config = DBConfig::GetConfig(segment.db);
		enable_fsst_vectors = config.options.enable_fsst_vectors;
	} else {
		enable_fsst_vectors = false;
	}

	auto baseptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto dict = GetDictionary(segment, scan_state.handle);
	auto base_data = data_ptr_cast(baseptr + sizeof(fsst_compression_header_t));
	string_t *result_data;

	if (scan_count == 0) {
		return;
	}

	if (enable_fsst_vectors) {
		D_ASSERT(result_offset == 0);
		if (scan_state.duckdb_fsst_decoder) {
			D_ASSERT(result_offset == 0 || result.GetVectorType() == VectorType::FSST_VECTOR);
			result.SetVectorType(VectorType::FSST_VECTOR);
			auto string_block_limit = StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize());
			FSSTVector::RegisterDecoder(result, scan_state.duckdb_fsst_decoder, string_block_limit);
			result_data = FSSTVector::GetCompressedData<string_t>(result);
		} else {
			D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
			result_data = FlatVector::GetData<string_t>(result);
		}
	} else {
		D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
		result_data = FlatVector::GetData<string_t>(result);
	}

	auto offsets = StartScan(scan_state, base_data, start, scan_count);
	auto &bitunpack_buffer = scan_state.bitunpack_buffer;
	auto &delta_decode_buffer = scan_state.delta_decode_buffer;
	if (enable_fsst_vectors) {
		// Lookup decompressed offsets in dict
		for (idx_t i = 0; i < scan_count; i++) {
			uint32_t string_length = bitunpack_buffer[i + offsets.scan_offset];
			result_data[i] = UncompressedStringStorage::FetchStringFromDict(
			    segment, dict.end, result, baseptr,
			    UnsafeNumericCast<int32_t>(delta_decode_buffer[i + offsets.unused_delta_decoded_values]),
			    string_length);
			FSSTVector::SetCount(result, scan_count);
		}
	} else {
		// Just decompress
		auto &str_buffer = StringVector::GetStringBuffer(result);
		for (idx_t i = 0; i < scan_count; i++) {
			result_data[i + result_offset] = scan_state.DecompressString(dict, baseptr, offsets, i, str_buffer);
		}
	}
	EndScan(scan_state, offsets, start, scan_count);
}